

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

bool __thiscall llvm::yaml::isNumeric(yaml *this,StringRef S)

{
  byte bVar1;
  size_type sVar2;
  void *pvVar3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  yaml *pyVar7;
  StringRef Input;
  StringRef Input_00;
  StringRef SVar8;
  StringRef SVar9;
  StringRef local_30;
  
  pcVar5 = S.Data;
  if (pcVar5 == (char *)0x0) {
    return false;
  }
  if (pcVar5 == (char *)0x4) {
    if (*(int *)this == 0x6e616e2e) {
      return true;
    }
    if (*(int *)this == 0x4e614e2e) {
      return true;
    }
    if (*(int *)this == 0x4e414e2e) {
      return true;
    }
  }
  else if (pcVar5 == (char *)0x1) {
    if (*this == (yaml)0x2b) {
      return false;
    }
    if (*this == (yaml)0x2d) {
      return false;
    }
  }
  if ((*this == (yaml)0x2d) || (pyVar7 = this, pcVar6 = pcVar5, *this == (yaml)0x2b)) {
    pyVar7 = this + 1;
    pcVar6 = pcVar5 + -1;
  }
  if (pcVar6 == (char *)0x4) {
    if (*(int *)pyVar7 == 0x666e692e) {
      return true;
    }
    if (*(int *)pyVar7 == 0x666e492e) {
      return true;
    }
    if (*(int *)pyVar7 == 0x464e492e) {
      return true;
    }
  }
  if (pcVar5 == (char *)0x1) {
LAB_00da4172:
    if (pcVar6 != (char *)0x0) {
      if (*pyVar7 == (yaml)0x2e) {
        if (pcVar6 == (char *)0x1) {
          if (*pyVar7 == (yaml)0x2e) {
            return false;
          }
        }
        else {
          pvVar3 = memchr("0123456789",(int)(char)pyVar7[1],0xb);
          if (pvVar3 == (void *)0x0) {
            return false;
          }
        }
      }
      if (*pyVar7 == (yaml)0x45) {
        return false;
      }
      if (*pyVar7 == (yaml)0x65) {
        return false;
      }
    }
    Input.Length = (size_t)pcVar6;
    Input.Data = (char *)pyVar7;
    SVar8 = isNumeric::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,Input);
    if (SVar8.Length == 0) {
      return true;
    }
    bVar1 = *SVar8.Data;
    if ((bVar1 == 0x2e) || ((bVar1 | 0x20) == 0x65)) {
      SVar9.Length = SVar8.Length - 1;
      pbVar4 = (byte *)(SVar8.Data + 1);
      if (bVar1 == 0x2e) {
        SVar9.Data = (char *)pbVar4;
        SVar9 = isNumeric::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,SVar9)
        ;
        if (SVar9.Length == 0) {
          return true;
        }
        if ((byte)(*SVar9.Data | 0x20U) != 0x65) {
          return false;
        }
        pbVar4 = (byte *)(SVar9.Data + 1);
        SVar9.Length = SVar9.Length - 1;
      }
      if (SVar9.Length != 0) {
        if ((*pbVar4 == 0x2d) || (*pbVar4 == 0x2b)) {
          SVar9.Length = SVar9.Length - 1;
          if (SVar9.Length == 0) {
            return false;
          }
          pbVar4 = pbVar4 + 1;
        }
        Input_00.Length = SVar9.Length;
        Input_00.Data = (char *)pbVar4;
        SVar9 = isNumeric::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,
                           Input_00);
        return SVar9.Length == 0;
      }
    }
    return false;
  }
  if (*(short *)this == 0x6f30) {
    if (pcVar5 < (char *)0x3) {
      return false;
    }
    pcVar6 = "01234567";
    SVar9.Length = 8;
  }
  else {
    if (*(short *)this != 0x7830) goto LAB_00da4172;
    if (pcVar5 < (char *)0x3) {
      return false;
    }
    pcVar6 = "0123456789abcdefABCDEF";
    SVar9.Length = 0x16;
  }
  local_30.Length = (size_t)(pcVar5 + -2);
  local_30.Data = (char *)(this + 2);
  SVar8.Length = SVar9.Length;
  SVar8.Data = pcVar6;
  sVar2 = StringRef::find_first_not_of(&local_30,SVar8,0);
  return sVar2 == 0xffffffffffffffff;
}

Assistant:

inline bool isNumeric(StringRef S) {
  const static auto skipDigits = [](StringRef Input) {
    return Input.drop_front(
        std::min(Input.find_first_not_of("0123456789"), Input.size()));
  };

  // Make S.front() and S.drop_front().front() (if S.front() is [+-]) calls
  // safe.
  if (S.empty() || S.equals("+") || S.equals("-"))
    return false;

  if (S.equals(".nan") || S.equals(".NaN") || S.equals(".NAN"))
    return true;

  // Infinity and decimal numbers can be prefixed with sign.
  StringRef Tail = (S.front() == '-' || S.front() == '+') ? S.drop_front() : S;

  // Check for infinity first, because checking for hex and oct numbers is more
  // expensive.
  if (Tail.equals(".inf") || Tail.equals(".Inf") || Tail.equals(".INF"))
    return true;

  // Section 10.3.2 Tag Resolution
  // YAML 1.2 Specification prohibits Base 8 and Base 16 numbers prefixed with
  // [-+], so S should be used instead of Tail.
  if (S.startswith("0o"))
    return S.size() > 2 &&
           S.drop_front(2).find_first_not_of("01234567") == StringRef::npos;

  if (S.startswith("0x"))
    return S.size() > 2 && S.drop_front(2).find_first_not_of(
                               "0123456789abcdefABCDEF") == StringRef::npos;

  // Parse float: [-+]? (\. [0-9]+ | [0-9]+ (\. [0-9]* )?) ([eE] [-+]? [0-9]+)?
  S = Tail;

  // Handle cases when the number starts with '.' and hence needs at least one
  // digit after dot (as opposed by number which has digits before the dot), but
  // doesn't have one.
  if (S.startswith(".") &&
      (S.equals(".") ||
       (S.size() > 1 && std::strchr("0123456789", S[1]) == nullptr)))
    return false;

  if (S.startswith("E") || S.startswith("e"))
    return false;

  enum ParseState {
    Default,
    FoundDot,
    FoundExponent,
  };
  ParseState State = Default;

  S = skipDigits(S);

  // Accept decimal integer.
  if (S.empty())
    return true;

  if (S.front() == '.') {
    State = FoundDot;
    S = S.drop_front();
  } else if (S.front() == 'e' || S.front() == 'E') {
    State = FoundExponent;
    S = S.drop_front();
  } else {
    return false;
  }

  if (State == FoundDot) {
    S = skipDigits(S);
    if (S.empty())
      return true;

    if (S.front() == 'e' || S.front() == 'E') {
      State = FoundExponent;
      S = S.drop_front();
    } else {
      return false;
    }
  }

  assert(State == FoundExponent && "Should have found exponent at this point.");
  if (S.empty())
    return false;

  if (S.front() == '+' || S.front() == '-') {
    S = S.drop_front();
    if (S.empty())
      return false;
  }

  return skipDigits(S).empty();
}